

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O0

string * __thiscall
vkt::SpirVAssembly::(anonymous_namespace)::makeLongUTF8String_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,size_t num4ByteChars)

{
  ulong local_58;
  size_t count;
  allocator<char> local_39;
  string local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> earthAfrica;
  size_t num4ByteChars_local;
  string *longString;
  
  earthAfrica.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,anon_var_dwarf_5df099,&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  for (local_58 = 0; local_58 < (ulong)earthAfrica.field_2._8_8_; local_58 = local_58 + 1) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_38);
  }
  std::__cxx11::string::~string(local_38);
  return __return_storage_ptr__;
}

Assistant:

inline std::string makeLongUTF8String (size_t num4ByteChars)
{
	// An example of a longest valid UTF-8 character.  Be explicit about the
	// character type because Microsoft compilers can otherwise interpret the
	// character string as being over wide (16-bit) characters. Ideally, we
	// would just use a C++11 UTF-8 string literal, but we want to support older
	// Microsoft compilers.
	const std::basic_string<char> earthAfrica("\xF0\x9F\x8C\x8D");
	std::string longString;
	longString.reserve(num4ByteChars * 4);
	for (size_t count = 0; count < num4ByteChars; count++)
	{
		longString += earthAfrica;
	}
	return longString;
}